

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<0,_2,_5,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  float scalar;
  VecAccess<float,_4,_3> local_68;
  Matrix<float,_2,_2> local_3c;
  Mat2 local_2c;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<2,5>((MatrixCaseUtils *)&local_3c,evalCtx,0);
  scalar = getInputValue<2,1>(local_10,1);
  tcu::operator+((tcu *)&local_2c,&local_3c,scalar);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_1c,&local_2c);
  tcu::Vector<float,_4>::xyz(&local_68,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_68,&local_1c);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_2c);
  tcu::Matrix<float,_2,_2>::~Matrix(&local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) + getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}